

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  long *plVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiListClipperData *pIVar4;
  ImGuiListClipperData *data;
  ImGuiContext *g;
  ImGuiListClipper *this_local;
  
  pIVar2 = GImGui;
  plVar1 = (long *)this->TempData;
  if (plVar1 != (long *)0x0) {
    if (((-1 < this->ItemsCount) && (this->ItemsCount < 0x7fffffff)) && (-1 < this->DisplayStart)) {
      ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
    }
    if ((ImGuiListClipper *)*plVar1 != this) {
      __assert_fail("data->ListClipper == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0xa47,"void ImGuiListClipper::End()");
    }
    *(int *)((long)plVar1 + 0xc) = (int)plVar1[3];
    iVar3 = pIVar2->ClipperTempDataStacked + -1;
    pIVar2->ClipperTempDataStacked = iVar3;
    if (0 < iVar3) {
      pIVar4 = ImVector<ImGuiListClipperData>::operator[]
                         (&pIVar2->ClipperTempData,pIVar2->ClipperTempDataStacked + -1);
      pIVar4->ListClipper->TempData = pIVar4;
    }
    this->TempData = (void *)0x0;
  }
  this->ItemsCount = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}